

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccgen.c
# Opt level: O0

Sym * sym_push2(Sym **ps,int v,int t,int c)

{
  Sym *__s;
  Sym *s;
  int c_local;
  int t_local;
  int v_local;
  Sym **ps_local;
  
  __s = sym_malloc();
  memset(__s,0,0x38);
  __s->v = v;
  (__s->type).t = t;
  (__s->field_3).field_0.c = c;
  __s->prev = *ps;
  *ps = __s;
  return __s;
}

Assistant:

ST_FUNC Sym* sym_push2(Sym** ps, int v, int t, int c) {
  Sym* s;

  s = sym_malloc();
  memset(s, 0, sizeof *s);
  s->v = v;
  s->type.t = t;
  s->c = c;
  /* add in stack */
  s->prev = *ps;
  *ps = s;
  return s;
}